

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O3

void DumpString(TString *s,DumpState *D)

{
  int iVar1;
  void *pvVar2;
  undefined8 uVar3;
  TString *pTVar4;
  lua_State *plVar5;
  size_t size;
  undefined8 local_18;
  
  pTVar4 = (TString *)&local_18;
  if (s == (TString *)0x0) {
    local_18 = (L_Umaxalign)0x0;
    if (D->status != 0) {
      return;
    }
    plVar5 = D->L;
    pvVar2 = D->data;
    uVar3 = 3.95252516672997e-323;
  }
  else {
    local_18 = (s->tsv).len + 1;
    if (D->status != 0) {
      return;
    }
    iVar1 = (*D->writer)(D->L,&local_18,8,D->data);
    D->status = iVar1;
    if (iVar1 != 0) {
      return;
    }
    pTVar4 = s + 1;
    plVar5 = D->L;
    pvVar2 = D->data;
    uVar3 = local_18;
  }
  iVar1 = (*D->writer)(plVar5,pTVar4,uVar3,pvVar2);
  D->status = iVar1;
  return;
}

Assistant:

static void DumpString(const TString* s, DumpState* D)
{
 if (s==NULL)
 {
  size_t size=0;
  DumpVar(size,D);
 }
 else
 {
  size_t size=s->tsv.len+1;		/* include trailing '\0' */
  DumpVar(size,D);
  DumpBlock(getstr(s),size*sizeof(char),D);
 }
}